

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

void __thiscall kj::Thread::~Thread(Thread *this)

{
  int osErrorNumber;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_thread_c__:80:5)>
  _kjDefer80;
  Fault f;
  
  if (this->detached == false) {
    _kjDefer80.canceled = false;
    _kjDefer80.func.this = this;
    osErrorNumber = pthread_join(this->threadId,(void **)0x0);
    if (osErrorNumber != 0) {
      kj::_::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++"
                 ,0x54,osErrorNumber,"pthread_join","");
      kj::_::Debug::Fault::~Fault(&f);
    }
    if ((this->state->exception).ptr.isSet == true) {
      Exception::Exception((Exception *)&f,&(this->state->exception).ptr.field_1.value);
      kj::_::NullableValue<kj::Exception>::operator=(&(this->state->exception).ptr,(void *)0x0);
      throwRecoverableException((Exception *)&f,0);
      Exception::~Exception((Exception *)&f);
    }
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/thread.c++:80:5)>
    ::~Deferred(&_kjDefer80);
  }
  return;
}

Assistant:

Thread::~Thread() noexcept(false) {
  if (!detached) {
    KJ_DEFER(state->unref());

    int pthreadResult = pthread_join(*reinterpret_cast<pthread_t*>(&threadId), nullptr);
    if (pthreadResult != 0) {
      KJ_FAIL_SYSCALL("pthread_join", pthreadResult) { break; }
    }

    KJ_IF_MAYBE(e, state->exception) {
      Exception ecopy = kj::mv(*e);
      state->exception = nullptr;  // don't complain of uncaught exception when deleting
      kj::throwRecoverableException(kj::mv(ecopy));
    }
  }
}